

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int export_tls12_params(ptls_buffer_t *output,int is_server,int session_reused,
                       ptls_cipher_suite_t *cipher,void *client_random,char *server_name,
                       ptls_iovec_t negotiated_protocol,void *enc_key,void *enc_iv,uint64_t enc_seq,
                       uint64_t enc_record_iv,void *dec_key,void *dec_iv,uint64_t dec_seq)

{
  uint8_t *puVar1;
  ushort uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  size_t len;
  ptls_aead_algorithm_t *ppVar10;
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  
  iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
  if (iVar9 == 0) {
    puVar3 = output->base;
    sVar4 = output->off;
    (puVar3 + sVar4)[0] = '\0';
    (puVar3 + sVar4)[1] = '\0';
    sVar4 = output->off;
    output->off = sVar4 + 2;
    iVar9 = ptls_buffer_reserve_aligned(output,1,'\0');
    if (iVar9 == 0) {
      output->base[output->off] = (uint8_t)is_server;
      output->off = output->off + 1;
      iVar9 = ptls_buffer_reserve_aligned(output,1,'\0');
      if (iVar9 == 0) {
        output->base[output->off] = (uint8_t)session_reused;
        output->off = output->off + 1;
        iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
        if (iVar9 == 0) {
          puVar3 = output->base;
          sVar5 = output->off;
          (puVar3 + sVar5)[0] = '\x03';
          (puVar3 + sVar5)[1] = '\x03';
          output->off = output->off + 2;
          uVar2 = cipher->id;
          iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
          if (iVar9 == 0) {
            *(ushort *)(output->base + output->off) = uVar2 << 8 | uVar2 >> 8;
            output->off = output->off + 2;
            iVar9 = ptls_buffer_reserve_aligned(output,0x20,'\0');
            if (iVar9 == 0) {
              puVar3 = output->base;
              sVar5 = output->off;
              uVar6 = *client_random;
              uVar7 = *(undefined8 *)((long)client_random + 8);
              uVar8 = *(undefined8 *)((long)client_random + 0x18);
              puVar1 = puVar3 + sVar5 + 0x10;
              *(undefined8 *)puVar1 = *(undefined8 *)((long)client_random + 0x10);
              *(undefined8 *)(puVar1 + 8) = uVar8;
              puVar3 = puVar3 + sVar5;
              *(undefined8 *)puVar3 = uVar6;
              *(undefined8 *)(puVar3 + 8) = uVar7;
              output->off = output->off + 0x20;
              iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
              if (iVar9 == 0) {
                puVar3 = output->base;
                sVar5 = output->off;
                (puVar3 + sVar5)[0] = '\0';
                (puVar3 + sVar5)[1] = '\0';
                sVar11 = output->off;
                sVar5 = sVar11 + 2;
                output->off = sVar5;
                sVar13 = sVar5;
                if (server_name != (char *)0x0) {
                  len = strlen(server_name);
                  iVar9 = ptls_buffer__do_pushv(output,server_name,len);
                  if (iVar9 != 0) {
                    return iVar9;
                  }
                  sVar13 = output->off;
                }
                uVar12 = sVar13 - sVar5;
                iVar9 = 0x20c;
                if (uVar12 < 0x10000) {
                  output->base[sVar11] = (uint8_t)(uVar12 >> 8);
                  output->base[sVar11 + 1] = (uint8_t)uVar12;
                  iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
                  if (iVar9 == 0) {
                    puVar3 = output->base;
                    sVar5 = output->off;
                    (puVar3 + sVar5)[0] = '\0';
                    (puVar3 + sVar5)[1] = '\0';
                    sVar5 = output->off;
                    output->off = sVar5 + 2;
                    iVar9 = ptls_buffer__do_pushv
                                      (output,negotiated_protocol.base,negotiated_protocol.len);
                    if (iVar9 == 0) {
                      uVar12 = output->off - (sVar5 + 2);
                      if (uVar12 < 0x10000) {
                        output->base[sVar5] = (uint8_t)(uVar12 >> 8);
                        output->base[sVar5 + 1] = (uint8_t)uVar12;
                        iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        puVar3 = output->base;
                        sVar5 = output->off;
                        (puVar3 + sVar5)[0] = '\0';
                        (puVar3 + sVar5)[1] = '\0';
                        sVar5 = output->off;
                        output->off = sVar5 + 2;
                        iVar9 = ptls_buffer__do_pushv(output,enc_key,cipher->aead->key_size);
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        iVar9 = ptls_buffer__do_pushv
                                          (output,enc_iv,(cipher->aead->tls12).fixed_iv_size);
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        iVar9 = ptls_buffer_reserve_aligned(output,8,'\0');
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        *(uint64_t *)(output->base + output->off) =
                             enc_seq >> 0x38 | (enc_seq & 0xff000000000000) >> 0x28 |
                             (enc_seq & 0xff0000000000) >> 0x18 | (enc_seq & 0xff00000000) >> 8 |
                             (enc_seq & 0xff000000) << 8 | (enc_seq & 0xff0000) << 0x18 |
                             (enc_seq & 0xff00) << 0x28 | enc_seq << 0x38;
                        output->off = output->off + 8;
                        ppVar10 = cipher->aead;
                        if ((ppVar10->tls12).record_iv_size != 0) {
                          iVar9 = ptls_buffer_reserve_aligned(output,8,'\0');
                          if (iVar9 != 0) {
                            return iVar9;
                          }
                          *(uint64_t *)(output->base + output->off) =
                               enc_record_iv >> 0x38 | (enc_record_iv & 0xff000000000000) >> 0x28 |
                               (enc_record_iv & 0xff0000000000) >> 0x18 |
                               (enc_record_iv & 0xff00000000) >> 8 |
                               (enc_record_iv & 0xff000000) << 8 |
                               (enc_record_iv & 0xff0000) << 0x18 | (enc_record_iv & 0xff00) << 0x28
                               | enc_record_iv << 0x38;
                          output->off = output->off + 8;
                          ppVar10 = cipher->aead;
                        }
                        iVar9 = ptls_buffer__do_pushv(output,dec_key,ppVar10->key_size);
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        iVar9 = ptls_buffer__do_pushv
                                          (output,dec_iv,(cipher->aead->tls12).fixed_iv_size);
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        iVar9 = ptls_buffer_reserve_aligned(output,8,'\0');
                        if (iVar9 != 0) {
                          return iVar9;
                        }
                        *(uint64_t *)(output->base + output->off) =
                             dec_seq >> 0x38 | (dec_seq & 0xff000000000000) >> 0x28 |
                             (dec_seq & 0xff0000000000) >> 0x18 | (dec_seq & 0xff00000000) >> 8 |
                             (dec_seq & 0xff000000) << 8 | (dec_seq & 0xff0000) << 0x18 |
                             (dec_seq & 0xff00) << 0x28 | dec_seq << 0x38;
                        sVar11 = output->off + 8;
                        output->off = sVar11;
                        uVar12 = sVar11 - (sVar5 + 2);
                        if (uVar12 < 0x10000) {
                          output->base[sVar5] = (uint8_t)(uVar12 >> 8);
                          output->base[sVar5 + 1] = (uint8_t)uVar12;
                          iVar9 = ptls_buffer_reserve_aligned(output,2,'\0');
                          if (iVar9 != 0) {
                            return iVar9;
                          }
                          puVar3 = output->base;
                          sVar5 = output->off;
                          (puVar3 + sVar5)[0] = '\0';
                          (puVar3 + sVar5)[1] = '\0';
                          sVar5 = output->off;
                          output->off = sVar5 + 2;
                          output->base[sVar5] = '\0';
                          output->base[sVar5 + 1] = '\0';
                          uVar12 = output->off - (sVar4 + 2);
                          if (0xffff < uVar12) {
                            return 0x20c;
                          }
                          output->base[sVar4] = (uint8_t)(uVar12 >> 8);
                          output->base[sVar4 + 1] = (uint8_t)uVar12;
                          return 0;
                        }
                      }
                      iVar9 = 0x20c;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int export_tls12_params(ptls_buffer_t *output, int is_server, int session_reused, ptls_cipher_suite_t *cipher,
                               const void *client_random, const char *server_name, ptls_iovec_t negotiated_protocol,
                               const void *enc_key, const void *enc_iv, uint64_t enc_seq, uint64_t enc_record_iv,
                               const void *dec_key, const void *dec_iv, uint64_t dec_seq)
{
    int ret;

    export_tls_params(output, is_server, session_reused, PTLS_PROTOCOL_VERSION_TLS12, cipher, client_random, server_name,
                      negotiated_protocol, {
                          ptls_buffer_pushv(output, enc_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, enc_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, enc_seq);
                          if (cipher->aead->tls12.record_iv_size != 0)
                              ptls_buffer_push64(output, enc_record_iv);
                          ptls_buffer_pushv(output, dec_key, cipher->aead->key_size);
                          ptls_buffer_pushv(output, dec_iv, cipher->aead->tls12.fixed_iv_size);
                          ptls_buffer_push64(output, dec_seq);
                      });
    ret = 0;

Exit:
    return ret;
}